

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Iterator * __thiscall leveldb::DBImpl::NewIterator(DBImpl *this,ReadOptions *options)

{
  long lVar1;
  Iterator *pIVar2;
  Iterator *pIVar3;
  Iterator *in_RSI;
  Comparator *in_RDI;
  long in_FS_OFFSET;
  Iterator *iter;
  uint32_t seed;
  SequenceNumber latest_snapshot;
  SequenceNumber *in_stack_00000050;
  ReadOptions *in_stack_00000058;
  DBImpl *in_stack_00000060;
  DBImpl *in_stack_ffffffffffffffa8;
  DBImpl *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = NewInternalIterator(in_stack_00000060,in_stack_00000058,in_stack_00000050,
                               (uint32_t *)latest_snapshot);
  user_comparator(in_stack_ffffffffffffffa8);
  pIVar3 = pIVar2;
  if ((in_RSI->cleanup_head_).function != (CleanupFunction)0x0) {
    SnapshotImpl::sequence_number((SnapshotImpl *)in_stack_ffffffffffffffa8);
  }
  pIVar3 = NewDBIterator(in_stack_ffffffffffffffe8,in_RDI,in_RSI,(SequenceNumber)pIVar3,
                         (uint32_t)((ulong)pIVar2 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pIVar3;
}

Assistant:

Iterator* DBImpl::NewIterator(const ReadOptions& options) {
  SequenceNumber latest_snapshot;
  uint32_t seed;
  Iterator* iter = NewInternalIterator(options, &latest_snapshot, &seed);
  return NewDBIterator(this, user_comparator(), iter,
                       (options.snapshot != nullptr
                            ? static_cast<const SnapshotImpl*>(options.snapshot)
                                  ->sequence_number()
                            : latest_snapshot),
                       seed);
}